

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O1

void mdct_butterfly_16(ogg_int32_t *x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  
  iVar6 = *x - x[8];
  iVar1 = x[8] + *x;
  x[8] = iVar1;
  iVar8 = x[1] - x[9];
  x[9] = x[9] + x[1];
  uVar5 = (uint)((ulong)((long)(iVar8 + iVar6) * 0x5a82799a) >> 0x1f) & 0xfffffffe;
  *x = uVar5;
  uVar9 = (uint)((ulong)((long)(iVar8 - iVar6) * 0x5a82799a) >> 0x1f) & 0xfffffffe;
  x[1] = uVar9;
  iVar7 = x[10] - x[2];
  x[10] = x[2] + x[10];
  iVar11 = x[3] - x[0xb];
  x[0xb] = x[0xb] + x[3];
  x[2] = iVar11;
  x[3] = iVar7;
  iVar6 = x[0xc] - x[4];
  x[0xc] = x[4] + x[0xc];
  iVar8 = x[0xd] - x[5];
  x[0xd] = x[5] + x[0xd];
  uVar12 = (uint)((ulong)((long)(iVar6 - iVar8) * 0x5a82799a) >> 0x1f) & 0xfffffffe;
  x[4] = uVar12;
  uVar4 = (uint)((ulong)((long)(iVar8 + iVar6) * 0x5a82799a) >> 0x1f) & 0xfffffffe;
  x[5] = uVar4;
  iVar6 = x[0xe] - x[6];
  iVar2 = x[6] + x[0xe];
  x[0xe] = iVar2;
  iVar8 = x[0xf] - x[7];
  iVar3 = x[7] + x[0xf];
  x[0xf] = iVar3;
  x[6] = iVar6;
  x[7] = iVar8;
  *x = (uVar4 - uVar9) + (iVar6 - iVar11);
  x[1] = (iVar8 - iVar7) - (uVar12 - uVar5);
  x[2] = (iVar6 - iVar11) - (uVar4 - uVar9);
  x[3] = (iVar8 - iVar7) + (uVar12 - uVar5);
  x[4] = (iVar6 + iVar11) - (uVar12 + uVar5);
  x[5] = (iVar8 + iVar7) - (uVar4 + uVar9);
  x[6] = uVar12 + uVar5 + iVar6 + iVar11;
  x[7] = iVar8 + iVar7 + uVar4 + uVar9;
  iVar6 = x[0xc] + iVar1;
  iVar1 = x[0xc] - iVar1;
  iVar8 = x[9] + x[0xd];
  iVar10 = x[0xd] - x[9];
  iVar7 = x[10] + iVar2;
  iVar2 = iVar2 - x[10];
  iVar11 = x[0xb] + iVar3;
  iVar3 = iVar3 - x[0xb];
  x[8] = iVar2 + iVar10;
  x[9] = iVar3 - iVar1;
  x[10] = iVar2 - iVar10;
  x[0xb] = iVar3 + iVar1;
  x[0xc] = iVar7 - iVar6;
  x[0xd] = iVar11 - iVar8;
  x[0xe] = iVar7 + iVar6;
  x[0xf] = iVar11 + iVar8;
  return;
}

Assistant:

STIN void mdct_butterfly_16(DATA_TYPE *x){

  REG_TYPE r0, r1;

	   r0 = x[ 0] - x[ 8]; x[ 8] += x[ 0];
	   r1 = x[ 1] - x[ 9]; x[ 9] += x[ 1];
	   x[ 0] = MULT31((r0 + r1) , cPI2_8);
	   x[ 1] = MULT31((r1 - r0) , cPI2_8);
	   MB();

	   r0 = x[10] - x[ 2]; x[10] += x[ 2];
	   r1 = x[ 3] - x[11]; x[11] += x[ 3];
	   x[ 2] = r1; x[ 3] = r0;
	   MB();

	   r0 = x[12] - x[ 4]; x[12] += x[ 4];
	   r1 = x[13] - x[ 5]; x[13] += x[ 5];
	   x[ 4] = MULT31((r0 - r1) , cPI2_8);
	   x[ 5] = MULT31((r0 + r1) , cPI2_8);
	   MB();

	   r0 = x[14] - x[ 6]; x[14] += x[ 6];
	   r1 = x[15] - x[ 7]; x[15] += x[ 7];
	   x[ 6] = r0; x[ 7] = r1;
	   MB();

	   mdct_butterfly_8(x);
	   mdct_butterfly_8(x+8);
}